

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transmitter_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Transmitter_PDU::Encode(Transmitter_PDU *this,KDataStream *stream)

{
  const_iterator cVar1;
  bool bVar2;
  KDataStream *pKVar3;
  reference pcVar4;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_38;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_30;
  const_iterator citrAntenna;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> local_20;
  const_iterator citrModulation;
  KDataStream *stream_local;
  Transmitter_PDU *this_local;
  
  citrModulation._M_current = (char *)stream;
  Radio_Communications_Header::Encode(&this->super_Radio_Communications_Header,stream);
  pKVar3 = DATA_TYPE::operator<<
                     ((KDataStream *)citrModulation._M_current,
                      &(this->m_RadioEntityType).super_DataTypeBase);
  pKVar3 = KDataStream::operator<<(pKVar3,this->m_ui8TransmitterState);
  pKVar3 = KDataStream::operator<<(pKVar3,this->m_ui8InputSource);
  pKVar3 = KDataStream::operator<<(pKVar3,this->m_ui16Padding1);
  pKVar3 = DATA_TYPE::operator<<(pKVar3,&(this->m_AntennaLocation).super_DataTypeBase);
  pKVar3 = KDataStream::operator<<(pKVar3,this->m_ui16AntennaPatternType);
  pKVar3 = KDataStream::operator<<(pKVar3,this->m_ui16AntennaPatternLength);
  pKVar3 = KDataStream::operator<<(pKVar3,this->m_ui64Freq);
  pKVar3 = KDataStream::operator<<(pKVar3,(float)this->m_f32TransmitFreqBW);
  pKVar3 = KDataStream::operator<<(pKVar3,(float)this->m_f32Power);
  pKVar3 = DATA_TYPE::operator<<(pKVar3,&(this->m_ModulationType).super_DataTypeBase);
  pKVar3 = DATA_TYPE::operator<<(pKVar3,&(this->m_CryptoSystem).super_DataTypeBase);
  pKVar3 = KDataStream::operator<<(pKVar3,this->m_ui8LengthOfModulationParam);
  pKVar3 = KDataStream::operator<<(pKVar3,this->m_ui16Padding2);
  KDataStream::operator<<(pKVar3,this->m_ui8Padding3);
  local_20._M_current =
       (char *)std::vector<char,_std::allocator<char>_>::begin(&this->m_vModulationParams);
  while( true ) {
    citrAntenna = std::vector<char,_std::allocator<char>_>::end(&this->m_vModulationParams);
    bVar2 = __gnu_cxx::operator!=(&local_20,&citrAntenna);
    cVar1 = citrModulation;
    if (!bVar2) break;
    pcVar4 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&local_20);
    KDataStream::operator<<((KDataStream *)cVar1._M_current,*pcVar4);
    __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
    operator++(&local_20);
  }
  local_30._M_current =
       (char *)std::vector<char,_std::allocator<char>_>::begin(&this->m_vAntennaPattern);
  while( true ) {
    local_38._M_current =
         (char *)std::vector<char,_std::allocator<char>_>::end(&this->m_vAntennaPattern);
    bVar2 = __gnu_cxx::operator!=(&local_30,&local_38);
    cVar1 = citrModulation;
    if (!bVar2) break;
    pcVar4 = __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
             operator*(&local_30);
    KDataStream::operator<<((KDataStream *)cVar1._M_current,*pcVar4);
    __gnu_cxx::__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>::
    operator++(&local_30);
  }
  return;
}

Assistant:

void Transmitter_PDU::Encode( KDataStream & stream ) const
{
    Radio_Communications_Header::Encode( stream );

    stream << KDIS_STREAM m_RadioEntityType
           << m_ui8TransmitterState
           << m_ui8InputSource
           << m_ui16Padding1
           << KDIS_STREAM m_AntennaLocation
           << m_ui16AntennaPatternType
           << m_ui16AntennaPatternLength
           << m_ui64Freq
           << m_f32TransmitFreqBW
           << m_f32Power
           << KDIS_STREAM m_ModulationType
           << KDIS_STREAM m_CryptoSystem
           << m_ui8LengthOfModulationParam
           << m_ui16Padding2
           << m_ui8Padding3;

    vector<KOCTET>::const_iterator citrModulation = m_vModulationParams.begin();

    for( ; citrModulation != m_vModulationParams.end(); ++citrModulation )
    {
        stream << *citrModulation;
    }

    vector<KOCTET>::const_iterator citrAntenna = m_vAntennaPattern.begin();

    for( ; citrAntenna != m_vAntennaPattern.end(); ++citrAntenna )
    {
        stream << *citrAntenna;
    }
}